

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.h
# Opt level: O3

void __thiscall
arangodb::velocypack::Buffer<unsigned_char>::grow(Buffer<unsigned_char> *this,ValueLength len)

{
  size_t __n;
  uchar *__ptr;
  pointer __p;
  uchar *__dest;
  _Vector_base<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
  *p_Var1;
  _Vector_base<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
  *__size;
  undefined1 auVar2 [16];
  double dVar3;
  undefined1 auVar4 [16];
  
  __n = this->_size;
  p_Var1 = (_Vector_base<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
            *)(len + __n);
  auVar2._8_4_ = (int)((ulong)p_Var1 >> 0x20);
  auVar2._0_8_ = p_Var1;
  auVar2._12_4_ = 0x45300000;
  auVar4._8_4_ = (int)(__n >> 0x20);
  auVar4._0_8_ = __n;
  auVar4._12_4_ = 0x45300000;
  dVar3 = (((double)CONCAT44(0x43300000,(int)__n) - 4503599627370496.0) +
          (auVar4._8_8_ - 1.9342813113834067e+25)) * 1.5;
  __size = (_Vector_base<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
            *)((long)(dVar3 - 9.223372036854776e+18) & (long)dVar3 >> 0x3f | (long)dVar3);
  if (dVar3 <= ((double)CONCAT44(0x43300000,(int)p_Var1) - 4503599627370496.0) +
               (auVar2._8_8_ - 1.9342813113834067e+25)) {
    __size = p_Var1;
  }
  __ptr = this->_buffer;
  if (__ptr != this->_local) {
    __dest = (uchar *)realloc(__ptr,(size_t)__size);
    if (__dest != (uchar *)0x0) goto LAB_001036b0;
    grow();
  }
  p_Var1 = __size;
  __dest = (uchar *)malloc((size_t)__size);
  if (__dest == (uchar *)0x0) {
    grow();
    __p = (p_Var1->_M_impl).super__Vector_impl_data._M_start;
    std::
    _Vector_base<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
    ::_M_deallocate(p_Var1,__p,
                    (long)(p_Var1->_M_impl).super__Vector_impl_data._M_end_of_storage - (long)__p >>
                    4);
    return;
  }
  memcpy(__dest,__ptr,__n);
LAB_001036b0:
  this->_buffer = __dest;
  this->_capacity = (ValueLength)__size;
  return;
}

Assistant:

void grow(ValueLength len) {
    VELOCYPACK_ASSERT(_size + len >= sizeof(_local));

    // need reallocation
    ValueLength newLen = _size + len;
    constexpr double growthFactor = 1.5;
    if (newLen < growthFactor * _size) {
      // ensure the buffer grows sensibly and not by 1 byte only
      newLen = static_cast<ValueLength>(growthFactor * _size);
    }
    VELOCYPACK_ASSERT(newLen > _size);

    // intentionally do not initialize memory here
    // intentionally also do not care about alignments here, as we
    // expect T to be 1-byte-aignable
    VELOCYPACK_ASSERT(newLen > 0);
    T* p;
    if (_buffer != _local) {
      p = static_cast<T*>(velocypack_realloc(_buffer, checkOverflow(newLen)));
      ensureValidPointer(p);
      // realloc will have copied the old data
    } else {
      p = static_cast<T*>(velocypack_malloc(checkOverflow(newLen)));
      ensureValidPointer(p);
      // copy existing data into buffer
      memcpy(p, _buffer, checkOverflow(_size));
    }
    poison(p + _capacity, newLen - _capacity);

    _buffer = p;
    _capacity = newLen;

    VELOCYPACK_ASSERT(_size <= _capacity);
  }